

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::TimeInfo::TimeInfo(TimeInfo *this,time_point now)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_RDI;
  size_t us_epoch;
  tm *lt_tm;
  tm new_time;
  time_t raw_time;
  duration<long,_std::ratio<1L,_1000000L>_> local_68 [2];
  tm *local_58;
  time_point *in_stack_ffffffffffffffb0;
  time_t local_18 [2];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_8;
  
  local_18[0] = std::chrono::_V2::system_clock::to_time_t(in_stack_ffffffffffffffb0);
  local_58 = localtime_r(local_18,(tm *)&stack0xffffffffffffffb0);
  *(int *)&in_RDI->__r = local_58->tm_year + 0x76c;
  *(int *)((long)&in_RDI->__r + 4) = local_58->tm_mon + 1;
  *(int *)&in_RDI[1].__r = local_58->tm_mday;
  *(int *)((long)&in_RDI[1].__r + 4) = local_58->tm_hour;
  *(int *)&in_RDI[2].__r = local_58->tm_min;
  *(int *)((long)&in_RDI[2].__r + 4) = local_58->tm_sec;
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_since_epoch(&local_8);
  local_68[0].__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (in_RDI);
  uVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(local_68);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2 / 1000;
  *(int *)&in_RDI[3].__r = SUB164(auVar1 % ZEXT816(1000),0);
  *(int *)((long)&in_RDI[3].__r + 4) = (int)(uVar2 % 1000);
  return;
}

Assistant:

SimpleLoggerMgr::TimeInfo::TimeInfo(std::chrono::system_clock::time_point now) {
    std::time_t raw_time = std::chrono::system_clock::to_time_t(now);
    std::tm new_time;

#if defined(__linux__) || defined(__APPLE__)
    std::tm* lt_tm = localtime_r(&raw_time, &new_time);

#elif defined(WIN32) || defined(_WIN32)
    localtime_s(&new_time, &raw_time);
    std::tm* lt_tm = &new_time;
#endif

    year =  lt_tm->tm_year + 1900;
    month = lt_tm->tm_mon + 1;
    day =   lt_tm->tm_mday;
    hour =  lt_tm->tm_hour;
    min =   lt_tm->tm_min;
    sec =   lt_tm->tm_sec;

    size_t us_epoch = std::chrono::duration_cast< std::chrono::microseconds >
                      ( now.time_since_epoch() ).count();
    msec = (us_epoch / 1000) % 1000;
    usec = us_epoch % 1000;
}